

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

FunctionSignature * __thiscall
Jinx::Impl::Parser::ParseFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Parser *this,VisibilityType scope,
          SignatureParseMode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  char cVar2;
  SymbolList *pSVar3;
  pointer pcVar4;
  size_type sVar5;
  long *ptr;
  ulong uVar6;
  pointer pbVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  _Vector_impl_data *p_Var12;
  pointer pSVar13;
  size_type __n;
  pointer pbVar14;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  String paramName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> n;
  FunctionSignatureParts signatureParts;
  int local_180;
  int local_17c;
  String local_178;
  int local_154;
  ulong local_150;
  long *local_148;
  ulong local_140;
  long local_138 [2];
  ulong local_128;
  VisibilityType local_120;
  SignatureParseMode local_11c;
  vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  local_118;
  undefined1 local_f8 [160];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  local_58;
  
  bVar8 = this->m_error;
  local_11c = mode;
  if ((((bool)bVar8 == false) &&
      (pSVar13 = (this->m_currentSymbol)._M_current,
      pSVar13 !=
      (this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish)) && (pSVar13->type == NewLine)) {
    Error<>(this,"Empty function signature");
    (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
    __return_storage_ptr__->m_id = 0;
    __return_storage_ptr__->m_visibility = Local;
    (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_libraryName).field_2;
    (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
    (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_118.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &(__return_storage_ptr__->m_libraryName).field_2;
  p_Var12 = &(__return_storage_ptr__->m_parts).
             super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
             ._M_impl.super__Vector_impl_data;
  local_154 = 0;
  local_150 = 0;
  local_17c = 0;
  local_180 = 0;
  local_128 = 0;
  bVar9 = false;
  local_120 = scope;
  while( true ) {
    if ((bVar8 & 1) == 0) break;
LAB_0012a0fc:
    local_f8[0x94] = false;
LAB_0012a0fe:
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._152_4_ = Any;
    local_f8._144_4_ = Name;
    local_f8._128_8_ = (arena_type *)local_f8;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)local_f8;
    bVar9 = CheckFunctionNamePart(this);
    if (!bVar9) {
      Error<>(this,"Invalid name in function signature");
      goto LAB_0012a543;
    }
    bVar9 = IsKeyword(((this->m_currentSymbol)._M_current)->type);
    local_f8._144_4_ = Name;
    ParseFunctionNamePart_abi_cxx11_(&local_178,this);
    std::
    vector<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::StaticAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,128ul,16ul>>
    ::emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>
              ((vector<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::StaticAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,128ul,16ul>>
                *)&local_58,&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      MemFree(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    cVar2 = this->m_error;
    while (cVar2 == '\0') {
      pSVar13 = (this->m_currentSymbol)._M_current;
      if ((pSVar13 ==
           (this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish) || (pSVar13->type != ForwardSlash)) break;
      this->m_lastLine = pSVar13->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar13 + 1;
      bVar10 = CheckFunctionNamePart(this);
      if (!bVar10) {
        Error<>(this,"Invalid name in function signature");
        goto LAB_0012a543;
      }
      ParseFunctionNamePart_abi_cxx11_(&local_178,this);
      pbVar7 = local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar7;
          pbVar14 = pbVar14 + 1) {
        local_148 = local_138;
        pcVar4 = (pbVar14->_M_dataplus)._M_p;
        std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                            &local_148,pcVar4,pcVar4 + pbVar14->_M_string_length);
        uVar6 = local_140;
        ptr = local_148;
        sVar5 = local_178._M_string_length;
        __n = local_140;
        if (local_178._M_string_length < local_140) {
          __n = local_178._M_string_length;
        }
        if (__n == 0) {
          if (local_140 == local_178._M_string_length) goto LAB_0012a37e;
        }
        else {
          iVar11 = bcmp(local_148,local_178._M_dataplus._M_p,__n);
          if ((uVar6 == sVar5) && (iVar11 == 0)) {
LAB_0012a37e:
            Error<>(this,"Duplicate alternative name in function signature");
            (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
            __return_storage_ptr__->m_id = 0;
            __return_storage_ptr__->m_visibility = Local;
            (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
            (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
            (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->m_parts).
            super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
            ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
            (__return_storage_ptr__->m_parts).
            super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            p_Var12->_M_start = (pointer)0x0;
            (__return_storage_ptr__->m_parts).
            super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if (local_148 != local_138) {
              MemFree(local_148,local_138[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              MemFree(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0012a592;
          }
        }
        if (ptr != local_138) {
          MemFree(ptr,local_138[0] + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ::push_back(&local_58,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        MemFree(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      cVar2 = this->m_error;
    }
    local_180 = local_180 + 1;
    local_150 = (ulong)((int)local_150 + 1);
    local_128 = CONCAT71((int7)(local_128 >> 8),(byte)local_128 | !bVar9);
    if (local_f8[0x94] == '\x01') {
      bVar9 = Expect(this,ParenClose,(char *)0x0);
      if (!bVar9) {
        Error<>(this,"Expected closing parentheses for optional function name part");
        goto LAB_0012a543;
      }
      local_17c = local_17c + 1;
      local_154 = local_154 + 1;
    }
    bVar9 = false;
LAB_0012a330:
    std::
    vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>::
    push_back(&local_118,(value_type *)local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ::~vector(&local_58);
    bVar8 = this->m_error;
  }
  pSVar3 = this->m_symbolList;
  pSVar13 = (this->m_currentSymbol)._M_current;
  if ((pSVar13 !=
       (pSVar3->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
       _M_impl.super__Vector_impl_data._M_finish) && (pSVar13->type == NewLine)) {
    if (((local_128 & 1) == 0 && local_180 == 1) &&
       ((long)local_118.
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_118.
              super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
              ._M_impl.super__Vector_impl_data._M_start == 0xc0)) {
      Error<>(this,"Function signature cannot match keyword");
    }
    else {
      if (local_180 != local_154) {
        FunctionSignature::FunctionSignature
                  (__return_storage_ptr__,local_120,
                   &((this->m_library).
                     super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_name,&local_118);
        goto LAB_0012a59a;
      }
      Error<>(this,"Function signature must have at least one non-optional name part");
    }
    (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
    __return_storage_ptr__->m_id = 0;
    __return_storage_ptr__->m_visibility = Local;
    (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
    (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var12->_M_start = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    goto LAB_0012a59a;
  }
  local_f8._144_4_ = Name;
  local_f8[0x94] = false;
  local_f8._152_4_ = Any;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pSVar13 ==
      (pSVar3->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
      .super__Vector_impl_data._M_finish) goto LAB_0012a0fc;
  if (pSVar13->type != CurlyOpen) {
    if (pSVar13->type != ParenOpen) goto LAB_0012a0fc;
    this->m_lastLine = pSVar13->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar13 + 1;
    local_f8[0x94] = true;
    goto LAB_0012a0fe;
  }
  this->m_lastLine = pSVar13->lineNumber;
  pSVar13 = pSVar13 + 1;
  (this->m_currentSymbol)._M_current = pSVar13;
  if (bVar9) {
    local_f8._128_8_ = (arena_type *)local_f8;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)local_f8;
    Error<>(this,"Functions cannot have multiple variables without a name separating them");
LAB_0012a543:
    (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
    __return_storage_ptr__->m_id = 0;
    __return_storage_ptr__->m_visibility = Local;
    (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
    (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var12->_M_start = (pointer)0x0;
    (__return_storage_ptr__->m_parts).
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    if ((local_180 != 0) && ((int)local_150 <= local_17c)) {
      local_f8._128_8_ = (arena_type *)local_f8;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)local_f8;
      Error<>(this,"Arguments can\'t be separated soley by optional parameters");
      goto LAB_0012a543;
    }
    local_f8._144_4_ = Parameter;
    local_f8._128_8_ = (arena_type *)local_f8;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
    ._M_impl.super__Tp_alloc_type.m_arena = (arena_type *)local_f8;
    if ((((pSVar3->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
          _M_impl.super__Vector_impl_data._M_finish != pSVar13) && ((ulong)pSVar13->type < 0x3f)) &&
       ((0x40308c0c80000000U >> ((ulong)pSVar13->type & 0x3f) & 1) != 0)) {
      local_f8._152_4_ = ParseValueType(this);
      bVar8 = this->m_error;
    }
    if ((((bVar8 & 1) != 0) ||
        (pSVar13 = (this->m_currentSymbol)._M_current,
        pSVar13 ==
        (this->m_symbolList->
        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
        super__Vector_impl_data._M_finish)) || (pSVar13->type != NameValue)) {
      if (local_11c == FunctionDefinition) {
        Error<>(this,"No variable name found in function signature");
        goto LAB_0012a543;
      }
LAB_0012a30e:
      bVar9 = true;
      local_150 = 0;
      Expect(this,CurlyClose,(char *)0x0);
      local_17c = 0;
      goto LAB_0012a330;
    }
    local_148 = (long *)CONCAT44(local_148._4_4_,0x13);
    symbols._M_len = 1;
    symbols._M_array = (iterator)&local_148;
    ParseMultiName_abi_cxx11_(&local_178,this,symbols);
    bVar9 = Library::PropertyNameExists
                      ((this->m_library).
                       super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &local_178);
    if (bVar9) {
      local_148 = (long *)local_178._M_dataplus._M_p;
      Error<char_const*>(this,"Function parameter name \'%s\' already exists as a property name",
                         (char **)&local_148);
      (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
      __return_storage_ptr__->m_id = 0;
      __return_storage_ptr__->m_visibility = Local;
      (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
      (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->m_parts).
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
      (__return_storage_ptr__->m_parts).
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var12->_M_start = (pointer)0x0;
      (__return_storage_ptr__->m_parts).
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
      ::push_back(&local_58,&local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      MemFree(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if (!bVar9) goto LAB_0012a30e;
  }
LAB_0012a592:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  ::~vector(&local_58);
LAB_0012a59a:
  std::
  vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>::
  ~vector(&local_118);
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Parser::ParseFunctionSignature(VisibilityType scope, SignatureParseMode mode)
	{
		if (Check(SymbolType::NewLine))
		{
			Error("Empty function signature");
			return FunctionSignature();
		}
		bool parsedParameter = false;
		bool parsedNonKeywordName = false;
		int parsedNameCount = 0;
		int optionalNameCount = 0;
		int parsedNameCountSection = 0;
		int optionalNameCountSection = 0;
		FunctionSignatureParts signatureParts;
		while (!Check(SymbolType::NewLine))
		{
			FunctionSignaturePart part;
			if (Accept(SymbolType::CurlyOpen))
			{
				if (parsedParameter)
				{
					Error("Functions cannot have multiple variables without a name separating them");
					return FunctionSignature();
				}
				if (parsedNameCount && parsedNameCountSection <= optionalNameCountSection)
				{
					Error("Arguments can't be separated soley by optional parameters");
					return FunctionSignature();
				}
				part.partType = FunctionSignaturePartType::Parameter;
				if (CheckValueType())
				{
					part.valueType = ParseValueType();
				}
				if (CheckName())
				{
					String paramName = ParseMultiName({ SymbolType::CurlyClose });
					if (m_library->PropertyNameExists(paramName))
					{
						Error("Function parameter name '%s' already exists as a property name", paramName.c_str());
						return FunctionSignature();
					}
					part.names.push_back(paramName);
				}
				else if (mode == SignatureParseMode::FunctionDefinition)
				{
					Error("No variable name found in function signature");
					return FunctionSignature();
				}
				Expect(SymbolType::CurlyClose);
				parsedParameter = true;
				parsedNameCountSection = 0;
				optionalNameCountSection = 0;
			}
			else
			{
				part.optional = Accept(SymbolType::ParenOpen);
				if (!CheckFunctionNamePart())
				{
					Error("Invalid name in function signature");
					return FunctionSignature();
				}
				parsedNameCount++;
				parsedNameCountSection++;
				if (IsKeyword(m_currentSymbol->type) == false)
					parsedNonKeywordName = true;
				part.partType = FunctionSignaturePartType::Name;
				part.names.push_back(ParseFunctionNamePart());
				while (Accept(SymbolType::ForwardSlash))
				{
					if (!CheckFunctionNamePart())
					{
						Error("Invalid name in function signature");
						return FunctionSignature();
					}
					auto name = ParseFunctionNamePart();
					for (auto n : part.names)
					{
						if (n == name)
						{
							Error("Duplicate alternative name in function signature");
							return FunctionSignature();
						}
					}
					part.names.push_back(name);
				}
				if (part.optional)
				{
					optionalNameCount++;
					optionalNameCountSection++;
					if (!Expect(SymbolType::ParenClose))
					{
						Error("Expected closing parentheses for optional function name part");
						return FunctionSignature();
					}
				}
				parsedParameter = false;
			}
			signatureParts.push_back(part);
		}

		// Check for function signature validity with matching keywords
		if (!parsedNonKeywordName)
		{
			if (parsedNameCount == 1 && signatureParts.size() == 1)
			{
				Error("Function signature cannot match keyword");
				return FunctionSignature();
			}
		}

		// Check to make sure the function has at least one non-optional keyword part
		if (parsedNameCount == optionalNameCount)
		{
			Error("Function signature must have at least one non-optional name part");
			return FunctionSignature();
		}

		// Create and return the function signature
		return FunctionSignature(scope, m_library->GetName(), signatureParts);
	}